

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  int iVar2;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *extension;
  string_view filename_00;
  string_view sVar3;
  string filename;
  char *local_68;
  string local_50;
  
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    local_68 = "text";
    extension = kWatExtension;
  }
  else if ((SVar1 == Binary) || (SVar1 == Text)) {
    local_68 = "binary";
    extension = kWasmExtension;
  }
  else {
    extension = "";
    local_68 = "";
  }
  iVar2 = (*module->_vptr_ScriptModule[2])(module);
  Stream::Writef(this->json_stream_,"\"%s\": ","line");
  Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0x10));
  Stream::Writef(this->json_stream_,", ");
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_(&local_50,this,extension);
  Stream::Writef(this->json_stream_,"\"%s\": ","filename");
  sVar3._M_str = extraout_RDX;
  sVar3._M_len = (size_t)local_50._M_dataplus._M_p;
  sVar3 = GetBasename((wabt *)local_50._M_string_length,sVar3);
  WriteEscapedString(this,sVar3);
  Stream::Writef(this->json_stream_,", ");
  Stream::Writef(this->json_stream_,"\"%s\": ","text");
  WriteEscapedString(this,text);
  Stream::Writef(this->json_stream_,", ");
  Stream::Writef(this->json_stream_,"\"%s\": ","module_type");
  Stream::Writef(this->json_stream_,"\"%s\"",local_68);
  filename_00._M_str = local_50._M_dataplus._M_p;
  filename_00._M_len = local_50._M_string_length;
  WriteScriptModule(this,filename_00,module);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          std::string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}